

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int __thiscall Board::place(Board *this,Block *block)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  lVar3 = (long)block->t;
  lVar5 = (long)block->o;
  lVar7 = 0;
  do {
    lVar4 = (long)blockShape[lVar3][lVar5][lVar7 * 2] + (long)block->x;
    lVar6 = (long)*(int *)(lVar5 * 0x20 + lVar3 * 0x80 + 0x11dda4 + lVar7 * 8) + (long)block->y;
    this->rows[lVar4] = this->rows[lVar4] | 1 << ((byte)lVar6 & 0x1f);
    this->cols[lVar6] = this->cols[lVar6] | 1 << ((byte)lVar4 & 0x1f);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  iVar2 = 0;
  do {
    lVar4 = (long)blockShape[lVar3][lVar5][lVar7 * 2] + (long)block->x;
    bVar8 = this->rows[lVar4] == 0xfff;
    if (!bVar8) {
      do {
        if (lVar4 == 1) {
          lVar6 = 0;
          break;
        }
        lVar6 = lVar4 + -1;
        lVar1 = lVar4 + -1;
        lVar4 = lVar6;
      } while (this->rows[lVar1] == 0xfff);
      bVar8 = ((uint)this->rows[(int)lVar6] >>
               (blockShape[lVar3][lVar5][lVar7 * 2 + 1] + block->y & 0x1fU) & 1) != 0;
    }
    iVar2 = iVar2 + (uint)bVar8;
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return iVar2;
    }
  } while( true );
}

Assistant:

int Board::place(const Block &block){
    int i, tmpX, tmpY;
    auto shape = blockShape[block.t][block.o];
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        rows[tmpX] |= 1 << tmpY;
        cols[tmpY] |= 1 << tmpX;
    }
    int basenum =0;
    for (i = 0; i < 4; ++i) {
        tmpX = block.x + shape[2 * i];
        tmpY = block.y + shape[2 * i + 1];
        bool base = rows[tmpX] == FULL_ROW;
        if (!base)
        {
            int t = tmpX - 1;
            while (t && rows[t] == FULL_ROW)
                --t;
            base = ((rows[t]>>tmpY)&1);
        }
        if (base)
            ++basenum;
    }
    return basenum;
}